

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

const_iterator __thiscall libcellml::Model::ModelImpl::findUnits(ModelImpl *this,UnitsPtr *units)

{
  shared_ptr<libcellml::Units> *psVar1;
  bool bVar2;
  __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  _Var3;
  __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  __it;
  long lVar4;
  long lVar5;
  __shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Units>const*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<libcellml::Units>const>>
                    ((this->mUnits).
                     super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->mUnits).
                     super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,units);
  psVar1 = (this->mUnits).
           super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var3._M_current != psVar1) {
    return (const_iterator)_Var3._M_current;
  }
  __it._M_current =
       (this->mUnits).
       super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,&units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_50,&local_60)
  ;
  std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_70,&local_50)
  ;
  std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,&local_70)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  std::__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_70,&local_40)
  ;
  lVar5 = (long)_Var3._M_current - (long)__it._M_current;
  for (lVar4 = lVar5 >> 6; 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
            ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                          *)&local_70,__it);
    _Var3._M_current = __it._M_current;
    if (bVar2) goto LAB_001f554b;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
            ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                          *)&local_70,__it._M_current + 1);
    _Var3._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_001f554b;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
            ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                          *)&local_70,__it._M_current + 2);
    _Var3._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_001f554b;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
            ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                          *)&local_70,__it._M_current + 3);
    _Var3._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_001f554b;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x40;
  }
  lVar5 = lVar5 >> 4;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var3._M_current = psVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
                  ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                                *)&local_70,__it), _Var3._M_current = __it._M_current, bVar2))
      goto LAB_001f554b;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
            ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                          *)&local_70,__it);
    _Var3._M_current = __it._M_current;
    if (bVar2) goto LAB_001f554b;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::$_0>
          ::operator()((_Iter_pred<libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                        *)&local_70,__it);
  _Var3._M_current = psVar1;
  if (bVar2) {
    _Var3._M_current = __it._M_current;
  }
LAB_001f554b:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  return (const_iterator)_Var3._M_current;
}

Assistant:

std::vector<UnitsPtr>::const_iterator Model::ModelImpl::findUnits(const UnitsPtr &units) const
{
    auto result = std::find(mUnits.begin(), mUnits.end(), units);
    if (result != mUnits.end()) {
        return result;
    }
    return std::find_if(mUnits.begin(), mUnits.end(),
                        [=](const UnitsPtr &u) -> bool { return u->equals(units); });
}